

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnExport
          (BinaryReaderInterp *this,Index index,ExternalKind kind,Index item_index,string_view name)

{
  ModuleDesc *pMVar1;
  Result RVar2;
  long lVar3;
  pointer pFVar4;
  string_view name_local;
  Location loc;
  Location loc_1;
  string local_98 [32];
  Var local_78;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.last_column = 0;
  loc_1.filename._M_len = (this->filename_)._M_len;
  loc_1.filename._M_str = (this->filename_)._M_str;
  loc_1.field_1.field_1.offset = loc.field_1.field_1.offset;
  Var::Var(&local_78,item_index,&loc_1);
  RVar2 = SharedValidator::OnExport(&this->validator_,&loc,kind,&local_78,name);
  Var::~Var(&local_78);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  switch(kind) {
  case First:
    pFVar4 = (this->func_types_).
             super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar3 = (ulong)item_index << 6;
    break;
  case Table:
    pFVar4 = (pointer)(this->table_types_).
                      super__Vector_base<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (ulong)item_index * 0x30;
    break;
  case Memory:
    pFVar4 = (pointer)(this->memory_types_).
                      super__Vector_base<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    goto LAB_00145e40;
  case Global:
    pFVar4 = (pointer)(this->global_types_).
                      super__Vector_base<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (ulong)item_index * 0x18;
    break;
  case Last:
    pFVar4 = (pointer)(this->tag_types_).
                      super__Vector_base<wabt::interp::TagType,_std::allocator<wabt::interp::TagType>_>
                      ._M_impl.super__Vector_impl_data._M_start;
LAB_00145e40:
    lVar3 = (ulong)item_index * 0x28;
    break;
  default:
    goto switchD_00145e0f_default;
  }
  (**(code **)(*(long *)((long)&(pFVar4->super_ExternType)._vptr_ExternType + lVar3) + 0x10))
            (&loc,(long)&(pFVar4->super_ExternType)._vptr_ExternType + lVar3);
switchD_00145e0f_default:
  pMVar1 = this->module_;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_98,&name_local,(allocator<char> *)&loc_1);
  std::__cxx11::string::string((string *)&loc,local_98);
  std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::
  emplace_back<wabt::interp::ExportDesc>(&pMVar1->exports,(ExportDesc *)&loc);
  ExportType::~ExportType((ExportType *)&loc);
  std::__cxx11::string::_M_dispose();
  return (Result)Ok;
}

Assistant:

Result BinaryReaderInterp::OnExport(Index index,
                                    ExternalKind kind,
                                    Index item_index,
                                    std::string_view name) {
  CHECK_RESULT(validator_.OnExport(GetLocation(), kind,
                                   Var(item_index, GetLocation()), name));

  std::unique_ptr<ExternType> type;
  switch (kind) {
    case ExternalKind::Func:   type = func_types_[item_index].Clone(); break;
    case ExternalKind::Table:  type = table_types_[item_index].Clone(); break;
    case ExternalKind::Memory: type = memory_types_[item_index].Clone(); break;
    case ExternalKind::Global: type = global_types_[item_index].Clone(); break;
    case ExternalKind::Tag:    type = tag_types_[item_index].Clone(); break;
  }
  module_.exports.push_back(
      ExportDesc{ExportType(std::string(name), std::move(type)), item_index});
  return Result::Ok;
}